

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  vec<Minisat::Lit> *this_00;
  int iVar1;
  char *pcVar2;
  int *__ptr;
  bool bVar3;
  undefined8 *puVar4;
  lbool lVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  vec<int> extra_frozen;
  rusage ru;
  vec<int> local_108;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  rusage local_c0;
  
  local_108.data = (int *)0x0;
  local_108.sz = 0;
  local_108.cap = 0;
  (this->super_Solver).systematic_branching_state = 1;
  bVar8 = do_simp & this->use_simplification;
  lVar5.value = false;
  getrusage(RUSAGE_SELF,&local_c0);
  local_d0 = (double)CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec);
  local_c8 = (double)local_c0.ru_utime.tv_usec;
  iVar1 = (this->super_Solver).trail.sz;
  lVar7 = (long)iVar1;
  if (bVar8 == 1) {
    if (0 < (this->super_Solver).assumptions.sz) {
      lVar6 = 0;
      do {
        local_c0.ru_utime.tv_sec._0_4_ = (this->super_Solver).assumptions.data[lVar6].x >> 1;
        pcVar2 = (this->frozen).data;
        if (pcVar2[(int)local_c0.ru_utime.tv_sec] == '\0') {
          pcVar2[(int)local_c0.ru_utime.tv_sec] = '\x01';
          vec<int>::push(&local_108,(int *)&local_c0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->super_Solver).assumptions.sz);
    }
    bVar3 = eliminate(this,false);
    lVar5.value = !bVar3;
  }
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  pcVar2 = (this->touched).data;
  if (pcVar2 != (char *)0x0) {
    (this->touched).sz = 0;
    free(pcVar2);
    (this->touched).data = (char *)0x0;
    (this->touched).cap = 0;
  }
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  __ptr = (this->n_occ).data;
  if (__ptr != (int *)0x0) {
    (this->n_occ).sz = 0;
    free(__ptr);
    (this->n_occ).data = (int *)0x0;
    (this->n_occ).cap = 0;
  }
  Heap<Minisat::SimpSolver::ElimLt>::clear(&this->elim_heap,true);
  Queue<unsigned_int>::clear(&this->subsumption_queue,true);
  getrusage(RUSAGE_SELF,&local_c0);
  local_e0 = (double)CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec);
  local_d8 = (double)local_c0.ru_utime.tv_usec;
  (this->super_Solver).check_satisfiability_simplified = true;
  if ((this->super_Solver).solves == 1) {
    this_00 = &(this->super_Solver).add_tmp;
    if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
      (this->super_Solver).add_tmp.sz = 0;
    }
    vec<Minisat::Lit>::push(this_00,(Lit *)&lit_Undef);
    if (iVar1 < (this->super_Solver).trail.sz) {
      do {
        ((this->super_Solver).add_tmp.data)->x = (this->super_Solver).trail.data[lVar7].x;
        Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>(&this->super_Solver,this_00,1);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->super_Solver).trail.sz);
    }
    if (this_00->data != (Lit *)0x0) {
      (this->super_Solver).add_tmp.sz = 0;
    }
  }
  if ((bool)lVar5.value == false) {
    lVar5 = Solver::solve_(&this->super_Solver);
  }
  else if (0 < (this->super_Solver).verbosity) {
    puts("c ===============================================================================");
  }
  getrusage(RUSAGE_SELF,&local_c0);
  local_e8 = (double)CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec);
  local_f0 = (double)local_c0.ru_utime.tv_usec;
  if (lVar5.value == '\0') {
    extendModel(this);
    if ((this->super_Solver).check_satisfiability == true) {
      bVar3 = Solver::SATchecker::checkModel
                        (&(this->super_Solver).satChecker,&(this->super_Solver).model);
      if (!bVar3) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "ERROR: detected model that does not satisfy input formula, abort";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      if ((this->super_Solver).verbosity != 0) {
        puts("c validated SAT answer after extending model");
      }
    }
  }
  if ((bVar8 != 0) && (0 < local_108.sz)) {
    lVar7 = 0;
    do {
      iVar1 = local_108.data[lVar7];
      (this->frozen).data[iVar1] = '\0';
      if ((this->use_simplification == true) &&
         (((iVar1 < (this->elim_heap).indices.sz && (-1 < (this->elim_heap).indices.data[iVar1])) ||
          (((this->frozen).data[iVar1] == '\0' &&
           (((this->eliminated).data[iVar1] == '\0' &&
            (((this->super_Solver).assigns.data[iVar1].value & 2) != 0)))))))) {
        Heap<Minisat::SimpSolver::ElimLt>::update(&this->elim_heap,iVar1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_108.sz);
  }
  local_f0 = local_f0 / 1000000.0 + local_e8 +
             ((local_c8 / 1000000.0 + local_d0) - (local_d8 / 1000000.0 + local_e0));
  (this->super_Solver).systematic_branching_state = 0;
  getrusage(RUSAGE_SELF,&local_c0);
  (this->super_Solver).statistics.simpSeconds =
       (((double)local_c0.ru_utime.tv_usec / 1000000.0 +
        (double)CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec)) - local_f0)
       + (this->super_Solver).statistics.simpSeconds;
  if (local_108.data != (int *)0x0) {
    local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
    free(local_108.data);
  }
  return (lbool)lVar5.value;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool result = l_True;

    systematic_branching_state = 1;

    do_simp &= use_simplification;
    double simp_time = cpuTime();

    const int pre_simplification_units = trail.size();

    if (do_simp) {
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++) {
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]) {
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            }
        }

        result = lbool(eliminate(turn_off_simp));
    }
    occurs.clear(true);
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    simp_time = cpuTime() - simp_time;      // stop timer and record time consumed until now
    check_satisfiability_simplified = true; // only check SAT answer after the call to extendModel()

    /* share units during initial call, only really useful in case preprocessing is used */
    if (solves == 1) {
        assert(decisionLevel() == 0);
        add_tmp.clear();
        add_tmp.push(lit_Undef);
        for (int i = pre_simplification_units; i < trail.size(); ++i) {
            add_tmp[0] = trail[i];
            shareViaCallback(add_tmp, 1);
        }
        add_tmp.clear();
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("c ===============================================================================\n");

    simp_time = cpuTime() - simp_time; // continue timer and consider time tracked already

    if (result == l_True) {
        extendModel();
        if (check_satisfiability) {
            if (!satChecker.checkModel(model)) {
                assert(false && "model should satisfy full input formula");
                throw("ERROR: detected model that does not satisfy input formula, abort");
                exit(1);
            } else if (verbosity)
                printf("c validated SAT answer after extending model\n");
        }
    }

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++) setFrozen(extra_frozen[i], false);

    systematic_branching_state = 0;
    statistics.simpSeconds += cpuTime() - simp_time; // stop timer and record time consumed until now

    return result;
}